

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockNameLengthContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  Node *pNVar1;
  string local_48;
  
  pNVar1 = parentStructure->m_ptr;
  if ((pNVar1->m_type == TYPE_INTERFACE_BLOCK) &&
     ((*(char *)&pNVar1[1]._vptr_Node != '\x01' ||
      (((pNVar1->m_enclosingNode).m_ptr)->m_type == TYPE_ARRAY_ELEMENT)))) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,0x96985f);
    generateBufferBackedVariableAggregateTypeCases
              (context,parentStructure,targetGroup,PROGRAMINTERFACE_UNIFORM,
               PROGRAMRESOURCEPROP_NAME_LENGTH,TYPE_FLOAT,&local_48,1);
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,0x96985f);
    generateBufferBackedVariableAggregateTypeCases
              (context,parentStructure,targetGroup,PROGRAMINTERFACE_UNIFORM,
               PROGRAMRESOURCEPROP_NAME_LENGTH,TYPE_FLOAT,&local_48,2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void generateUniformBlockNameLengthContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const bool	isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool	namedNonArrayBlock	= isInterfaceBlock																					&&
									  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
									  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock || namedNonArrayBlock)
		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_NAME_LENGTH, glu::TYPE_FLOAT, "", 2);
	else
		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_NAME_LENGTH, glu::TYPE_FLOAT, "", 1);
}